

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite21_Test::TestBody
          (LiteBasicTest_AllLite21_Test *this)

{
  TestMapLite message1;
  TestMapLite message2;
  TestMapLite TStack_4b8;
  TestMapLite local_260;
  
  proto2_unittest::TestMapLite::TestMapLite(&TStack_4b8);
  proto2_unittest::TestMapLite::TestMapLite(&local_260);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>(&TStack_4b8);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>(&TStack_4b8);
  MapTestUtil::ExpectClear<proto2_unittest::TestMapLite>(&local_260);
  proto2_unittest::TestMapLite::Swap(&TStack_4b8,&local_260);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>(&local_260);
  MapTestUtil::ExpectClear<proto2_unittest::TestMapLite>(&TStack_4b8);
  proto2_unittest::TestMapLite::~TestMapLite(&local_260);
  proto2_unittest::TestMapLite::~TestMapLite(&TStack_4b8);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite21) {
  {
    // SwapWithEmpty
    proto2_unittest::TestMapLite message1, message2;

    MapTestUtil::SetMapFields(&message1);
    MapTestUtil::ExpectMapFieldsSet(message1);
    MapTestUtil::ExpectClear(message2);

    message1.Swap(&message2);
    MapTestUtil::ExpectMapFieldsSet(message2);
    MapTestUtil::ExpectClear(message1);
  }
}